

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&> * __thiscall
Catch::ExprLhs<type_safe::flag_set<test_flags>const&>::operator==
          (BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&>
           *__return_storage_ptr__,ExprLhs<type_safe::flag_set<test_flags>const&> *this,
          test_flags *rhs)

{
  flag_set<test_flags> *lhs;
  bool comparisonResult;
  StringRef local_30;
  test_flags *local_20;
  test_flags *rhs_local;
  ExprLhs<const_type_safe::flag_set<test_flags>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (test_flags *)this;
  this_local = (ExprLhs<const_type_safe::flag_set<test_flags>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<type_safe::flag_set<test_flags>,test_flags>(*(flag_set<test_flags> **)this,rhs);
  lhs = *(flag_set<test_flags> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_type_safe::flag_set<test_flags>_&,_const_test_flags_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }